

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::ThriftSender_testManyMessages_Test::TestBody
          (ThriftSender_testManyMessages_Test *this)

{
  byte bVar1;
  UDPTransporter *this_00;
  element_type *this_01;
  element_type *this_02;
  AssertHelper local_490 [8];
  Message local_488 [12];
  int local_47c;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string_view local_438;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> local_428;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_408;
  time_point local_3e8;
  time_point local_3e0;
  allocator local_3d1;
  string local_3d0;
  SpanContext local_3b0;
  Span local_300 [8];
  Span span;
  int local_18c;
  int i;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  ThriftSender local_178 [4];
  int kNumMessages;
  ThriftSender sender;
  IPAddress local_e0;
  unique_ptr<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
  local_48;
  unique_ptr<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
  transporter;
  undefined1 local_30 [8];
  shared_ptr<const_jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  ThriftSender_testManyMessages_Test *this_local;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer_const,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)local_30);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr
            ((shared_ptr<opentracing::v3::Tracer> *)&transporter);
  this_00 = (UDPTransporter *)operator_new(0xc0);
  this_01 = std::
            __shared_ptr_access<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&tracer.
                             super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
  this_02 = std::
            __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this_01);
  testutils::MockAgent::spanServerAddress(&local_e0,this_02);
  jaegertracing::utils::UDPTransporter::UDPTransporter(this_00,&local_e0,0);
  std::
  unique_ptr<jaegertracing::utils::Transport,std::default_delete<jaegertracing::utils::Transport>>::
  unique_ptr<std::default_delete<jaegertracing::utils::Transport>,void>
            ((unique_ptr<jaegertracing::utils::Transport,std::default_delete<jaegertracing::utils::Transport>>
              *)&local_48,(pointer)this_00);
  jaegertracing::ThriftSender::ThriftSender(local_178,(unique_ptr *)&local_48);
  logger._M_t.
  super___uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::logging::Logger_*,_std::default_delete<jaegertracing::logging::Logger>_>
  .super__Head_base<0UL,_jaegertracing::logging::Logger_*,_false>._M_head_impl._4_4_ = 2000;
  jaegertracing::logging::consoleLogger();
  for (local_18c = 0; local_18c < 2000; local_18c = local_18c + 1) {
    SpanContext::SpanContext(&local_3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d0,"",&local_3d1);
    local_3e0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_3e8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_408.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_408);
    local_428.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
              (&local_428);
    Span::Span(local_300,(shared_ptr<const_jaegertracing::Tracer> *)local_30,&local_3b0,&local_3d0,
               &local_3e0,&local_3e8,&local_408,&local_428);
    std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
              (&local_428);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_408);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    SpanContext::~SpanContext(&local_3b0);
    std::__cxx11::to_string(&local_478,local_18c);
    std::operator+(&local_458,"test",&local_478);
    opentracing::v3::string_view::string_view(&local_438,&local_458);
    Span::SetOperationName(local_300,local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    bVar1 = testing::internal::AlwaysTrue();
    if ((bVar1 & 1) == 0) {
      testing::Message::Message(local_488);
      testing::internal::AssertHelper::AssertHelper
                (local_490,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
                 ,0x54,
                 "Expected: sender.append(span) doesn\'t throw an exception.\n  Actual: it throws.")
      ;
      testing::internal::AssertHelper::operator=(local_490,local_488);
      testing::internal::AssertHelper::~AssertHelper(local_490);
      testing::Message::~Message(local_488);
      local_47c = 1;
    }
    else {
      bVar1 = testing::internal::AlwaysTrue();
      if ((bVar1 & 1) != 0) {
        jaegertracing::ThriftSender::append((Span *)local_178);
      }
      local_47c = 0;
    }
    Span::~Span(local_300);
    if (local_47c != 0) goto LAB_002a33f8;
  }
  local_47c = 0;
LAB_002a33f8:
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
               *)&stack0xfffffffffffffe78);
  ThriftSender::~ThriftSender(local_178);
  std::
  unique_ptr<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
  ::~unique_ptr(&local_48);
  std::shared_ptr<const_jaegertracing::Tracer>::~shared_ptr
            ((shared_ptr<const_jaegertracing::Tracer> *)local_30);
  std::shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>::~shared_ptr
            ((shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> *)
             &tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ThriftSender, testManyMessages)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    std::unique_ptr<utils::Transport> transporter(
        new utils::UDPTransporter(handle->_mockAgent->spanServerAddress(), 0));
    ThriftSender sender(
        std::forward<std::unique_ptr<utils::Transport>>(transporter));
    constexpr auto kNumMessages = 2000;
    const auto logger = logging::consoleLogger();
    for (auto i = 0; i < kNumMessages; ++i) {
        Span span(tracer);
        span.SetOperationName("test" + std::to_string(i));
        ASSERT_NO_THROW(sender.append(span));
    }
}